

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool testing::internal::TuplePrefix<2ul>::
     Matches<std::tuple<testing::Matcher<void*>,testing::Matcher<unsigned_long>>,std::tuple<void*,unsigned_long>>
               (tuple<testing::Matcher<void_*>,_testing::Matcher<unsigned_long>_> *matcher_tuple,
               tuple<void_*,_unsigned_long> *value_tuple)

{
  bool bVar1;
  
  bVar1 = MatcherBase<void_*>::Matches
                    ((MatcherBase<void_*> *)
                     &(matcher_tuple->
                      super__Tuple_impl<0UL,_testing::Matcher<void_*>,_testing::Matcher<unsigned_long>_>
                      ).super__Head_base<0UL,_testing::Matcher<void_*>,_false>,
                     &(value_tuple->super__Tuple_impl<0UL,_void_*,_unsigned_long>).
                      super__Head_base<0UL,_void_*,_false>._M_head_impl);
  if (bVar1) {
    bVar1 = MatcherBase<unsigned_long>::Matches
                      ((MatcherBase<unsigned_long> *)matcher_tuple,(unsigned_long *)value_tuple);
    return bVar1;
  }
  return false;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple) &&
           std::get<N - 1>(matcher_tuple).Matches(std::get<N - 1>(value_tuple));
  }